

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigSetActivityFactors_rec(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,int LevelMin,int LevelMax)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  sat_solver *psVar4;
  int iVar5;
  Vec_Ptr_t *p_00;
  Ivy_Obj_t *pIVar6;
  int local_40;
  int local_3c;
  int Counter;
  int i;
  Ivy_Obj_t *pFanin;
  Vec_Ptr_t *vFanins;
  int LevelMax_local;
  int LevelMin_local;
  Ivy_Obj_t *pObj_local;
  Ivy_FraigMan_t *p_local;
  
  local_40 = 0;
  iVar5 = Ivy_IsComplement(pObj);
  if (iVar5 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0xa2d,
                  "int Ivy_FraigSetActivityFactors_rec(Ivy_FraigMan_t *, Ivy_Obj_t *, int, int)");
  }
  iVar5 = Ivy_ObjSatNum(pObj);
  if (iVar5 != 0) {
    iVar5 = Ivy_ObjIsTravIdCurrent(p->pManFraig,pObj);
    if (iVar5 == 0) {
      Ivy_ObjSetTravIdCurrent(p->pManFraig,pObj);
      if (((uint)LevelMin < *(uint *)&pObj->field_0x8 >> 0xb) &&
         (iVar5 = Ivy_ObjIsPi(pObj), iVar5 == 0)) {
        dVar1 = p->pParams->dActConeBumpMax;
        uVar2 = *(uint *)&pObj->field_0x8;
        pdVar3 = p->pSat->factors;
        iVar5 = Ivy_ObjSatNum(pObj);
        pdVar3[iVar5] =
             (dVar1 * (double)(int)((uVar2 >> 0xb) - LevelMin)) / (double)(LevelMax - LevelMin);
        psVar4 = p->pSat;
        iVar5 = Ivy_ObjSatNum(pObj);
        veci_push(&psVar4->act_vars,iVar5);
        p_00 = Ivy_ObjFaninVec(pObj);
        for (local_3c = 0; iVar5 = Vec_PtrSize(p_00), local_3c < iVar5; local_3c = local_3c + 1) {
          pIVar6 = (Ivy_Obj_t *)Vec_PtrEntry(p_00,local_3c);
          pIVar6 = Ivy_Regular(pIVar6);
          iVar5 = Ivy_FraigSetActivityFactors_rec(p,pIVar6,LevelMin,LevelMax);
          local_40 = iVar5 + local_40;
        }
        p_local._4_4_ = local_40 + 1;
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
    return p_local._4_4_;
  }
  __assert_fail("Ivy_ObjSatNum(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0xa2e,
                "int Ivy_FraigSetActivityFactors_rec(Ivy_FraigMan_t *, Ivy_Obj_t *, int, int)");
}

Assistant:

int Ivy_FraigSetActivityFactors_rec( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, int LevelMin, int LevelMax )
{
    Vec_Ptr_t * vFanins;
    Ivy_Obj_t * pFanin;
    int i, Counter = 0;
    assert( !Ivy_IsComplement(pObj) );
    assert( Ivy_ObjSatNum(pObj) );
    // skip visited variables
    if ( Ivy_ObjIsTravIdCurrent(p->pManFraig, pObj) )
        return 0;
    Ivy_ObjSetTravIdCurrent(p->pManFraig, pObj);
    // add the PI to the list
    if ( pObj->Level <= (unsigned)LevelMin || Ivy_ObjIsPi(pObj) )
        return 0;
    // set the factor of this variable
    // (LevelMax-LevelMin) / (pObj->Level-LevelMin) = p->pParams->dActConeBumpMax / ThisBump
    p->pSat->factors[Ivy_ObjSatNum(pObj)] = p->pParams->dActConeBumpMax * (pObj->Level - LevelMin)/(LevelMax - LevelMin);
    veci_push(&p->pSat->act_vars, Ivy_ObjSatNum(pObj));
    // explore the fanins
    vFanins = Ivy_ObjFaninVec( pObj );
    Vec_PtrForEachEntry( Ivy_Obj_t *, vFanins, pFanin, i )
        Counter += Ivy_FraigSetActivityFactors_rec( p, Ivy_Regular(pFanin), LevelMin, LevelMax );
    return 1 + Counter;
}